

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::UniformCase::getUniforms
          (UniformCase *this,
          vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
          *valuesDst,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL)

{
  CallLogWrapper *this_00;
  pointer pBVar1;
  ostringstream *poVar2;
  uint uVar3;
  TestLog *pTVar4;
  _Alloc_hider _Var5;
  GLint location;
  uint uVar6;
  deUint32 err;
  GLenum GVar7;
  pointer pBVar8;
  int line;
  ulong uVar9;
  VarValue *value_00;
  char *msg;
  long lVar10;
  string queryName;
  VarValue value;
  GLint unit;
  bool local_254;
  long *local_238 [2];
  long local_228 [2];
  undefined1 local_218 [4];
  GLfloat aGStack_214 [17];
  string local_1d0;
  undefined1 local_1b0 [384];
  
  pBVar8 = (basicUniforms->
           super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(basicUniforms->
                          super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar8) >> 3) *
      0x286bca1b < 1) {
    local_254 = true;
  }
  else {
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &this->super_CallLogWrapper;
    local_254 = true;
    lVar10 = 0;
    do {
      pBVar1 = pBVar8 + lVar10;
      if ((((this->super_CallLogWrapper).field_0x15 & 2) == 0) || (pBVar8[lVar10].elemNdx != 0)) {
        local_238[0] = local_228;
        _Var5._M_p = (pBVar1->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,_Var5._M_p,_Var5._M_p + (pBVar1->name)._M_string_length);
      }
      else {
        std::__cxx11::string::rfind((char)pBVar1,0x5b);
        std::__cxx11::string::substr((ulong)local_238,(ulong)pBVar1);
      }
      location = glu::CallLogWrapper::glGetUniformLocation(this_00,programGL,(GLchar *)local_238[0])
      ;
      uVar6 = glu::getDataTypeScalarSize(pBVar1->type);
      aGStack_214[0xb] = -4.3160208e+08;
      aGStack_214[0xc] = -4.3160208e+08;
      aGStack_214[0xd] = -4.3160208e+08;
      aGStack_214[0xe] = -4.3160208e+08;
      aGStack_214[7] = -4.3160208e+08;
      aGStack_214[8] = -4.3160208e+08;
      aGStack_214[9] = -4.3160208e+08;
      aGStack_214[10] = -4.3160208e+08;
      aGStack_214[3] = -4.3160208e+08;
      aGStack_214[4] = -4.3160208e+08;
      aGStack_214[5] = -4.3160208e+08;
      aGStack_214[6] = -4.3160208e+08;
      aGStack_214[1] = -4.3160208e+08;
      aGStack_214[2] = -4.3160208e+08;
      aGStack_214[0xf] = -4.3160208e+08;
      if (location == -1) {
        _local_218 = 0xcdcdcdcd00000000;
        std::
        vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
        ::push_back(valuesDst,(value_type *)local_218);
        if (pBVar1->isUsedInShader == true) {
          poVar2 = (ostringstream *)(local_1b0 + 8);
          local_1b0._0_8_ = pTVar4;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// FAILURE: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(pBVar1->name)._M_dataplus._M_p,
                     (pBVar1->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," was used in shader, but has location -1",0x28);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          local_254 = false;
        }
      }
      else {
        local_218 = (undefined1  [4])pBVar1->type;
        aGStack_214[0] = -4.3160208e+08;
        if (((int)local_218 - TYPE_FLOAT < 4) ||
           ((int)local_218 - TYPE_FLOAT_MAT2 < 9 || (int)local_218 - TYPE_DOUBLE_MAT2 < 9)) {
          glu::CallLogWrapper::glGetUniformfv(this_00,programGL,location,(GLfloat *)(local_218 + 4))
          ;
          err = glu::CallLogWrapper::glGetError(this_00);
          line = 0x6d4;
          msg = "glGetUniformfv(programGL, location, &value.val.floatV[0])";
LAB_005ef98b:
          glu::checkError(err,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                          ,line);
        }
        else {
          if ((int)local_218 - TYPE_INT < 4) {
            glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)(local_218 + 4))
            ;
            err = glu::CallLogWrapper::glGetError(this_00);
            line = 0x6d6;
            msg = "glGetUniformiv(programGL, location, &value.val.intV[0])";
            goto LAB_005ef98b;
          }
          if ((int)local_218 - TYPE_UINT < 4) {
            glu::CallLogWrapper::glGetUniformuiv
                      (this_00,programGL,location,(GLuint *)(local_218 + 4));
            err = glu::CallLogWrapper::glGetError(this_00);
            line = 0x6d8;
            msg = "glGetUniformuiv(programGL, location, &value.val.uintV[0])";
            goto LAB_005ef98b;
          }
          if ((int)local_218 - TYPE_BOOL < 4) {
            uVar3 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
            if ((uVar3 & 0x40) == 0) {
              if ((char)uVar3 < '\0') {
                glu::CallLogWrapper::glGetUniformuiv
                          (this_00,programGL,location,(GLuint *)(local_218 + 4));
                GVar7 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar7,"glGetUniformuiv(programGL, location, &value.val.uintV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                                ,0x6e3);
                if (0 < (int)uVar6) {
                  uVar9 = 0;
                  do {
                    local_218[uVar9 + 4] = *(int *)(local_218 + uVar9 * 4 + 4) != 0;
                    uVar9 = uVar9 + 1;
                  } while (uVar6 != uVar9);
                }
              }
              else {
                glu::CallLogWrapper::glGetUniformfv
                          (this_00,programGL,location,(GLfloat *)(local_218 + 4));
                GVar7 = glu::CallLogWrapper::glGetError(this_00);
                glu::checkError(GVar7,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                                ,0x6e9);
                if (0 < (int)uVar6) {
                  uVar9 = 0;
                  do {
                    local_218[uVar9 + 4] = *(float *)(local_218 + uVar9 * 4 + 4) != 0.0;
                    uVar9 = uVar9 + 1;
                  } while (uVar6 != uVar9);
                }
              }
            }
            else {
              glu::CallLogWrapper::glGetUniformiv
                        (this_00,programGL,location,(GLint *)(local_218 + 4));
              GVar7 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar7,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                              ,0x6dd);
              if (0 < (int)uVar6) {
                uVar9 = 0;
                do {
                  local_218[uVar9 + 4] = *(int *)(local_218 + uVar9 * 4 + 4) != 0;
                  uVar9 = uVar9 + 1;
                } while (uVar6 != uVar9);
              }
            }
          }
          else if ((int)local_218 - TYPE_SAMPLER_1D < 0x1e) {
            local_1b0._0_4_ = 0xffffffff;
            glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)local_1b0);
            GVar7 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar7,"glGetUniformiv(programGL, location, &unit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fUniformApiTests.cpp"
                            ,0x6f1);
            aGStack_214[0] = (GLfloat)local_1b0._0_4_;
          }
        }
        std::
        vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
        ::push_back(valuesDst,(value_type *)local_218);
        poVar2 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = pTVar4;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// Got ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(pBVar1->name)._M_dataplus._M_p,(pBVar1->name)._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," value ",7);
        apiVarValueStr_abi_cxx11_(&local_1d0,(Functional *)local_218,value_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),local_1d0._M_dataplus._M_p,local_1d0._M_string_length)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      lVar10 = lVar10 + 1;
      pBVar8 = (basicUniforms->
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar10 < (int)((ulong)((long)(basicUniforms->
                                          super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar8
                                   ) >> 3) * 0x286bca1b);
  }
  return local_254;
}

Assistant:

bool UniformCase::getUniforms (vector<VarValue>& valuesDst, const vector<BasicUniform>& basicUniforms, const deUint32 programGL)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const string			queryName	= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				location	= glGetUniformLocation(programGL, queryName.c_str());
		const int				size		= glu::getDataTypeScalarSize(uniform.type);
		VarValue				value;

		deMemset(&value, 0xcd, sizeof(value)); // Initialize to known garbage.

		if (location == -1)
		{
			value.type = glu::TYPE_INVALID;
			valuesDst.push_back(value);
			if (uniform.isUsedInShader)
			{
				log << TestLog::Message << "// FAILURE: " << uniform.name << " was used in shader, but has location -1" << TestLog::EndMessage;
				success = false;
			}
			continue;
		}

		value.type = uniform.type;

		DE_STATIC_ASSERT(sizeof(GLint) == sizeof(value.val.intV[0]));
		DE_STATIC_ASSERT(sizeof(GLuint) == sizeof(value.val.uintV[0]));
		DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(value.val.floatV[0]));

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
		else if (glu::isDataTypeUintOrUVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformuiv(programGL, location, &value.val.uintV[0]));
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
		{
			if (m_features & FEATURE_BOOLEANAPITYPE_INT)
			{
				GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.intV[i] != 0;
			}
			else if (m_features & FEATURE_BOOLEANAPITYPE_UINT)
			{
				GLU_CHECK_CALL(glGetUniformuiv(programGL, location, &value.val.uintV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.uintV[i] != 0;
			}
			else // Default: use float.
			{
				GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.floatV[i] != 0.0f;
			}
		}
		else if (glu::isDataTypeSampler(uniform.type))
		{
			GLint unit = -1;
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &unit));
			value.val.samplerV.unit = unit;
		}
		else
			DE_ASSERT(false);

		valuesDst.push_back(value);

		log << TestLog::Message << "// Got " << uniform.name << " value " << apiVarValueStr(value) << TestLog::EndMessage;
	}

	return success;
}